

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_record.cc
# Opt level: O0

RM_Record * __thiscall RM_Record::operator=(RM_Record *this,RM_Record *record)

{
  char *pcVar1;
  ulong uVar2;
  RM_Record *record_local;
  RM_Record *this_local;
  
  if (this != record) {
    if ((this->data != (char *)0x0) && (this->data != (char *)0x0)) {
      operator_delete__(this->data);
    }
    this->size = record->size;
    uVar2 = (ulong)this->size;
    if ((long)uVar2 < 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pcVar1 = (char *)operator_new__(uVar2);
    this->data = pcVar1;
    memcpy(this->data,record->data,(long)record->size);
    RID::operator=(&this->rid,&record->rid);
  }
  return this;
}

Assistant:

RM_Record& RM_Record::operator= (const RM_Record &record){
  if (this != &record){
    if(this->data != NULL)  // make sure the memory allocation is for the
      delete [] data;       // correct size of the record
    this->size = record.size;
    this->data = new char[size];
    memcpy(this->data, record.data, record.size);
    this->rid = record.rid;
  }
  return (*this);
}